

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O2

vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *
vkt::pipeline::getLevelsVector<tcu::Texture3D>
          (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
           *__return_storage_ptr__,Texture3D *texture)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pPVar3;
  pointer pPVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  allocator_type local_19;
  
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::vector
            (__return_storage_ptr__,
             (long)(int)(((long)(texture->super_TextureLevelPyramid).m_access.
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(texture->super_TextureLevelPyramid).m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x28),&local_19);
  pPVar3 = (__return_storage_ptr__->
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar8 = 0;
  for (lVar9 = 0;
      pPVar4 = (texture->super_TextureLevelPyramid).m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,
      lVar9 < (int)(((long)(texture->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4) / 0x28);
      lVar9 = lVar9 + 1) {
    *(undefined8 *)((long)(&(pPVar3->super_ConstPixelBufferAccess).m_pitch + 1) + lVar8) =
         *(undefined8 *)((long)(&(pPVar4->super_ConstPixelBufferAccess).m_pitch + 1) + lVar8);
    puVar1 = (undefined8 *)((long)(pPVar4->super_ConstPixelBufferAccess).m_size.m_data + lVar8 + -8)
    ;
    uVar5 = *puVar1;
    uVar6 = puVar1[1];
    puVar1 = (undefined8 *)((long)(pPVar4->super_ConstPixelBufferAccess).m_size.m_data + lVar8 + 8U)
    ;
    uVar7 = puVar1[1];
    puVar2 = (undefined8 *)((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data + lVar8 + 8U)
    ;
    *puVar2 = *puVar1;
    puVar2[1] = uVar7;
    puVar1 = (undefined8 *)((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data + lVar8 + -8)
    ;
    *puVar1 = uVar5;
    puVar1[1] = uVar6;
    lVar8 = lVar8 + 0x28;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::PixelBufferAccess> getLevelsVector (const TcuTextureType& texture)
{
	std::vector<tcu::PixelBufferAccess> levels(texture.getNumLevels());

	for (int levelNdx = 0; levelNdx < texture.getNumLevels(); levelNdx++)
		levels[levelNdx] = *reinterpret_cast<const tcu::PixelBufferAccess*>(&texture.getLevel(levelNdx));

	return levels;
}